

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteSceneLibrary(ColladaExporter *this)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  aiNode *paVar4;
  ostream *poVar5;
  size_t a;
  ulong uVar6;
  string scene_name_escaped;
  string sStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string
            ((string *)&sStack_c8,(this->mScene->mRootNode->mName).data,(allocator *)&local_a8);
  XMLEscape(&local_88,&sStack_c8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<library_visual_scenes>");
  psVar3 = &this->endstr;
  std::operator<<(poVar5,(string *)psVar3);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  std::operator+(&local_68,"<visual_scene id=\"",&local_88);
  std::operator+(&local_48,&local_68,"\" name=\"");
  std::operator+(&local_a8,&local_48,&local_88);
  std::operator+(&sStack_c8,&local_a8,"\">");
  poVar5 = std::operator<<(poVar5,(string *)&sStack_c8);
  std::operator<<(poVar5,(string *)psVar3);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  PushTag(this);
  uVar6 = 0;
  while( true ) {
    paVar4 = this->mScene->mRootNode;
    if (paVar4->mNumChildren <= uVar6) break;
    WriteNode(this,this->mScene,paVar4->mChildren[uVar6]);
    uVar6 = uVar6 + 1;
  }
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</visual_scene>");
  std::operator<<(poVar5,(string *)psVar3);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</library_visual_scenes>");
  std::operator<<(poVar5,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void ColladaExporter::WriteSceneLibrary()
{
    const std::string scene_name_escaped = XMLEscape(mScene->mRootNode->mName.C_Str());

    mOutput << startstr << "<library_visual_scenes>" << endstr;
    PushTag();
    mOutput << startstr << "<visual_scene id=\"" + scene_name_escaped + "\" name=\"" + scene_name_escaped + "\">" << endstr;
    PushTag();

    // start recursive write at the root node
    for( size_t a = 0; a < mScene->mRootNode->mNumChildren; ++a )
        WriteNode( mScene, mScene->mRootNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</visual_scene>" << endstr;
    PopTag();
    mOutput << startstr << "</library_visual_scenes>" << endstr;
}